

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::GLES2Renderer::render
          (GLES2Renderer *this,int width,int height,Frame *frame)

{
  glUseProgramFunc p_Var1;
  glScissorFunc p_Var2;
  glClearColorFunc p_Var3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  deUint32 dVar8;
  GLenum GVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ColoredRect *pCVar15;
  const_reference pvVar16;
  const_reference pvVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uchar local_98;
  uchar local_97;
  uchar local_96;
  undefined1 local_95;
  uchar local_94;
  uchar local_93;
  uchar local_92;
  undefined1 local_91;
  GLubyte colors [24];
  float local_78;
  float local_74;
  GLfloat coords [12];
  float y2;
  float x2;
  float y1;
  float x1;
  ColoredRect *coloredRect;
  size_t drawNdx;
  Frame *frame_local;
  int height_local;
  int width_local;
  GLES2Renderer *this_local;
  
  for (coloredRect = (ColoredRect *)0x0;
      pCVar15 = (ColoredRect *)
                std::
                vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ::size(&frame->draws), coloredRect < pCVar15;
      coloredRect = (ColoredRect *)((long)(coloredRect->bottomLeft).m_data + 1)) {
    pvVar16 = std::
              vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ::operator[](&frame->draws,(size_type)coloredRect);
    pCVar15 = &pvVar16->rect;
    pvVar17 = std::
              vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ::operator[](&frame->draws,(size_type)coloredRect);
    if (pvVar17->drawType == DRAWTYPE_GLES2_RENDER) {
      iVar7 = tcu::Vector<int,_2>::x(&pCVar15->bottomLeft);
      fVar18 = windowToDeviceCoordinates(iVar7,width);
      iVar7 = tcu::Vector<int,_2>::y(&pCVar15->bottomLeft);
      fVar19 = windowToDeviceCoordinates(iVar7,height);
      iVar7 = tcu::Vector<int,_2>::x(&(pvVar16->rect).topRight);
      fVar20 = windowToDeviceCoordinates(iVar7,width);
      iVar7 = tcu::Vector<int,_2>::y(&(pvVar16->rect).topRight);
      coords[1] = windowToDeviceCoordinates(iVar7,height);
      local_78 = fVar18;
      local_74 = fVar19;
      coords[0] = fVar18;
      coords[2] = fVar20;
      coords[3] = coords[1];
      coords[4] = fVar20;
      coords[5] = coords[1];
      coords[6] = fVar20;
      coords[7] = fVar19;
      coords[8] = fVar18;
      coords[9] = fVar19;
      local_98 = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      local_97 = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      local_96 = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      local_95 = 0xff;
      local_94 = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      local_93 = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      local_92 = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      local_91 = 0xff;
      colors[0] = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      colors[1] = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      colors[2] = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      colors[3] = 0xff;
      colors[4] = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      colors[5] = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      colors[6] = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      colors[7] = 0xff;
      colors[8] = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      colors[9] = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      colors[10] = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      colors[0xb] = 0xff;
      colors[0xc] = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
      colors[0xd] = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
      colors[0xe] = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
      colors[0xf] = 0xff;
      p_Var1 = this->m_gl->useProgram;
      dVar8 = glu::ShaderProgram::getProgram(&this->m_glProgram);
      (*p_Var1)(dVar8);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x11a);
      (*this->m_gl->enableVertexAttribArray)(this->m_coordLoc);
      (*this->m_gl->enableVertexAttribArray)(this->m_colorLoc);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"Failed to enable attributes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x11e);
      (*this->m_gl->vertexAttribPointer)(this->m_coordLoc,2,0x1406,'\0',0,&local_78);
      (*this->m_gl->vertexAttribPointer)(this->m_colorLoc,4,0x1401,'\x01',0,&local_98);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"Failed to set attribute pointers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x122);
      (*this->m_gl->drawArrays)(4,0,6);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"glDrawArrays(), failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x125);
      (*this->m_gl->disableVertexAttribArray)(this->m_coordLoc);
      (*this->m_gl->disableVertexAttribArray)(this->m_colorLoc);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"Failed to disable attributes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x129);
      (*this->m_gl->useProgram)(0);
      GVar9 = (*this->m_gl->getError)();
      glu::checkError(GVar9,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,300);
    }
    else {
      pvVar17 = std::
                vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ::operator[](&frame->draws,(size_type)coloredRect);
      if (pvVar17->drawType == DRAWTYPE_GLES2_CLEAR) {
        (*this->m_gl->enable)(0xc11);
        p_Var2 = this->m_gl->scissor;
        iVar7 = tcu::Vector<int,_2>::x(&pCVar15->bottomLeft);
        iVar10 = tcu::Vector<int,_2>::y(&pCVar15->bottomLeft);
        iVar11 = tcu::Vector<int,_2>::x(&(pvVar16->rect).topRight);
        iVar12 = tcu::Vector<int,_2>::x(&pCVar15->bottomLeft);
        iVar13 = tcu::Vector<int,_2>::y(&(pvVar16->rect).topRight);
        iVar14 = tcu::Vector<int,_2>::y(&pCVar15->bottomLeft);
        (*p_Var2)(iVar7,iVar10,iVar11 - iVar12,iVar13 - iVar14);
        p_Var3 = this->m_gl->clearColor;
        bVar4 = tcu::Vector<unsigned_char,_3>::x(&(pvVar16->rect).color);
        bVar5 = tcu::Vector<unsigned_char,_3>::y(&(pvVar16->rect).color);
        bVar6 = tcu::Vector<unsigned_char,_3>::z(&(pvVar16->rect).color);
        (*p_Var3)((float)bVar4 / 255.0,(float)bVar5 / 255.0,(float)bVar6 / 255.0,1.0);
        (*this->m_gl->clear)(0x4000);
        (*this->m_gl->disable)(0xc11);
      }
    }
  }
  return;
}

Assistant:

void GLES2Renderer::render (int width, int height, const Frame& frame) const
{
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& coloredRect = frame.draws[drawNdx].rect;

		if (frame.draws[drawNdx].drawType == PartialUpdateTest::DRAWTYPE_GLES2_RENDER)
		{
			const float x1 = windowToDeviceCoordinates(coloredRect.bottomLeft.x(), width);
			const float y1 = windowToDeviceCoordinates(coloredRect.bottomLeft.y(), height);
			const float x2 = windowToDeviceCoordinates(coloredRect.topRight.x(), width);
			const float y2 = windowToDeviceCoordinates(coloredRect.topRight.y(), height);

			const glw::GLfloat coords[] =
			{
				x1, y1,
				x1, y2,
				x2, y2,

				x2, y2,
				x2, y1,
				x1, y1,
			};

			const glw::GLubyte colors[] =
			{
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,

				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
			};

			m_gl.useProgram(m_glProgram.getProgram());
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() failed");

			m_gl.enableVertexAttribArray(m_coordLoc);
			m_gl.enableVertexAttribArray(m_colorLoc);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to enable attributes");

			m_gl.vertexAttribPointer(m_coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords);
			m_gl.vertexAttribPointer(m_colorLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, colors);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to set attribute pointers");

			m_gl.drawArrays(GL_TRIANGLES, 0, DE_LENGTH_OF_ARRAY(coords)/2);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays(), failed");

			m_gl.disableVertexAttribArray(m_coordLoc);
			m_gl.disableVertexAttribArray(m_colorLoc);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to disable attributes");

			m_gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() failed");
		}
		else if (frame.draws[drawNdx].drawType == PartialUpdateTest::DRAWTYPE_GLES2_CLEAR)
		{
			m_gl.enable(GL_SCISSOR_TEST);
			m_gl.scissor(coloredRect.bottomLeft.x(), coloredRect.bottomLeft.y(),
						 coloredRect.topRight.x()-coloredRect.bottomLeft.x(), coloredRect.topRight.y()-coloredRect.bottomLeft.y());
			m_gl.clearColor(coloredRect.color.x()/255.0f, coloredRect.color.y()/255.0f, coloredRect.color.z()/255.0f, 1.0f);
			m_gl.clear(GL_COLOR_BUFFER_BIT);
			m_gl.disable(GL_SCISSOR_TEST);
		}
		else
			DE_FATAL("Invalid drawtype");
	}
}